

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.h
# Opt level: O3

void __thiscall
AckThread::WaitAckSession::WaitAckSession
          (WaitAckSession *this,uint32_t session_id,string *dst_ip,uint16_t dst_port)

{
  (this->dst_ip)._M_dataplus._M_p = (pointer)&(this->dst_ip).field_2;
  (this->dst_ip)._M_string_length = 0;
  (this->dst_ip).field_2._M_local_buf[0] = '\0';
  this->dst_port = 0;
  (this->wait_ack_packets).super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->wait_ack_packets;
  (this->wait_ack_packets).super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->wait_ack_packets;
  (this->wait_ack_packets).super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl.
  _M_node._M_size = 0;
  this->previous_ack_base_packet_number = -1;
  this->previous_ack_packet_number_mask = -1;
  this->session_id = session_id;
  std::__cxx11::string::_M_assign((string *)&this->dst_ip);
  this->dst_port = dst_port;
  return;
}

Assistant:

WaitAckSession(uint32_t session_id, const std::string& dst_ip, uint16_t dst_port) {
			this->session_id = session_id;
			this->dst_ip = dst_ip;
			this->dst_port = dst_port;
		}